

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O0

void embree::triangle_intersect_func(RTCIntersectFunctionNArguments *args)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  bool bVar3;
  type pMVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  long in_RDI;
  float fVar9;
  float fVar10;
  float fVar12;
  float fVar13;
  undefined1 auVar11 [16];
  float t;
  bool valid;
  float v;
  float u;
  float rcpDen;
  float den;
  Vec3fa R;
  Vec3fa C;
  Vec3fa D;
  Vec3fa O;
  Vec3fa Ng;
  Vec3fa e2;
  Vec3fa e1;
  value_type *v2;
  value_type *v1;
  value_type *v0;
  Mesh *mesh;
  uint geomID;
  uint primID;
  Ray *ray;
  void *ptr;
  vfloat4 b1_1;
  vfloat4 a1_1;
  vfloat4 b0_1;
  vfloat4 a0_1;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  __m128 r;
  __m128 a_1;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_2;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_3;
  vfloat4 c_3;
  vfloat4 b_3;
  vfloat4 a_4;
  unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
  *in_stack_ffffffffffffea10;
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *this;
  undefined8 local_1588;
  float fStack_1580;
  undefined4 uStack_1554;
  undefined4 uStack_1550;
  undefined8 local_1548;
  float fStack_1540;
  undefined4 local_14f0;
  undefined8 local_1488;
  float fStack_1480;
  undefined8 local_13d8;
  float fStack_13d0;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float local_c48;
  float fStack_c44;
  float local_be8;
  float fStack_be4;
  float local_b58;
  float local_b38;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float local_38;
  
  puVar2 = *(undefined8 **)(in_RDI + 0x20);
  uVar1 = *(undefined4 *)(in_RDI + 0x10);
  local_14f0 = (undefined4)*(ulong *)(in_RDI + 8);
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
  ::operator[]((vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
                *)meshes,*(ulong *)(in_RDI + 8) & 0xffffffff);
  pMVar4 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
           operator*(in_stack_ffffffffffffea10);
  this = &pMVar4->x_;
  pvVar5 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                     (&pMVar4->tris_,(ulong)*(uint *)(in_RDI + 0x10));
  pvVar6 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                     (this,(long)pvVar5->v0);
  pvVar5 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                     (&pMVar4->tris_,(ulong)*(uint *)(in_RDI + 0x10));
  pvVar7 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                     (&pMVar4->x_,(long)pvVar5->v1);
  pvVar5 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                     (&pMVar4->tris_,(ulong)*(uint *)(in_RDI + 0x10));
  pvVar8 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                     (&pMVar4->x_,(long)pvVar5->v2);
  local_1148 = (float)*(undefined8 *)&pvVar6->field_0;
  fStack_1144 = (float)((ulong)*(undefined8 *)&pvVar6->field_0 >> 0x20);
  fStack_1140 = (float)*(undefined8 *)((long)&pvVar6->field_0 + 8);
  local_1158 = (float)*(undefined8 *)&pvVar7->field_0;
  fStack_1154 = (float)((ulong)*(undefined8 *)&pvVar7->field_0 >> 0x20);
  fStack_1150 = (float)*(undefined8 *)((long)&pvVar7->field_0 + 8);
  local_1128 = (float)*(undefined8 *)&pvVar8->field_0;
  fStack_1124 = (float)((ulong)*(undefined8 *)&pvVar8->field_0 >> 0x20);
  fStack_1120 = (float)*(undefined8 *)((long)&pvVar8->field_0 + 8);
  local_1138 = (float)*(undefined8 *)&pvVar6->field_0;
  fStack_1134 = (float)((ulong)*(undefined8 *)&pvVar6->field_0 >> 0x20);
  fStack_1130 = (float)*(undefined8 *)((long)&pvVar6->field_0 + 8);
  local_b58 = (float)((ulong)local_1548 >> 0x20);
  local_be8 = (float)local_13d8;
  fStack_be4 = (float)((ulong)local_13d8 >> 0x20);
  local_be8 = (local_1148 - local_1158) * local_b58 - local_be8;
  fStack_be4 = (fStack_1144 - fStack_1154) * fStack_1540 - fStack_be4;
  fVar12 = (fStack_1140 - fStack_1150) * (float)local_1548 - fStack_13d0;
  local_1108 = (float)*(undefined8 *)&pvVar6->field_0;
  fStack_1104 = (float)((ulong)*(undefined8 *)&pvVar6->field_0 >> 0x20);
  fStack_1100 = (float)*(undefined8 *)((long)&pvVar6->field_0 + 8);
  local_1118 = (float)*puVar2;
  fStack_1114 = (float)((ulong)*puVar2 >> 0x20);
  fStack_1110 = (float)puVar2[1];
  local_b28 = (float)puVar2[2];
  fStack_b24 = (float)((ulong)puVar2[2] >> 0x20);
  fStack_b20 = (float)puVar2[3];
  local_b38 = (float)((ulong)local_1588 >> 0x20);
  local_c48 = (float)local_1488;
  fStack_c44 = (float)((ulong)local_1488 >> 0x20);
  local_c48 = local_b28 * local_b38 - local_c48;
  fStack_c44 = fStack_b24 * fStack_1580 - fStack_c44;
  fVar13 = fStack_b20 * (float)local_1588 - fStack_1480;
  fVar9 = fStack_be4 * local_b28 + fVar12 * fStack_b24 + local_be8 * fStack_b20;
  auVar11 = rcpss(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
  local_38 = auVar11._0_4_;
  local_38 = local_38 * (2.0 - local_38 * fVar9);
  fVar10 = (fStack_c44 * (local_1128 - local_1138) + fVar13 * (fStack_1124 - fStack_1134) +
           local_c48 * (fStack_1120 - fStack_1130)) * local_38;
  fVar13 = (fStack_c44 * (local_1148 - local_1158) + fVar13 * (fStack_1144 - fStack_1154) +
           local_c48 * (fStack_1140 - fStack_1150)) * local_38;
  bVar3 = fVar10 + fVar13 <= 1.0;
  if ((((fVar9 != 0.0 && 0.0 <= fVar10) && 0.0 <= fVar13) && bVar3) &&
     (local_38 = (fStack_be4 * (local_1108 - local_1118) + fVar12 * (fStack_1104 - fStack_1114) +
                 local_be8 * (fStack_1100 - fStack_1110)) * local_38,
     (((fVar9 != 0.0 && 0.0 <= fVar10) && 0.0 <= fVar13) && bVar3) &&
     ((*(float *)((long)puVar2 + 0xc) <= local_38 && local_38 != *(float *)((long)puVar2 + 0xc)) &&
     local_38 < *(float *)(puVar2 + 4)))) {
    *(float *)(puVar2 + 4) = local_38;
    *(float *)((long)puVar2 + 0x3c) = fVar10;
    *(float *)(puVar2 + 8) = fVar13;
    *(undefined4 *)(puVar2 + 9) = local_14f0;
    *(undefined4 *)((long)puVar2 + 0x44) = uVar1;
    *(float *)(puVar2 + 6) = fStack_be4;
    *(undefined4 *)((long)puVar2 + 0x34) = uStack_1554;
    *(undefined4 *)(puVar2 + 7) = uStack_1550;
  }
  return;
}

Assistant:

void triangle_intersect_func(const RTCIntersectFunctionNArguments* args)
{
  void* ptr  = args->geometryUserPtr;
  ::Ray* ray = (::Ray*)args->rayhit;
  unsigned int primID = args->primID;
  unsigned geomID = (unsigned) (size_t) ptr;
  auto const & mesh = *meshes[geomID];
  
  auto & v0 = mesh.x_[mesh.tris_[args->primID].v0];
  auto & v1 = mesh.x_[mesh.tris_[args->primID].v1];
  auto & v2 = mesh.x_[mesh.tris_[args->primID].v2];
  auto e1 = v0-v1;
  auto e2 = v2-v0;
  auto Ng = cross(e1,e2);

  /* calculate denominator */
  auto O = Vec3fa(ray->org);
  auto D = Vec3fa(ray->dir);
  auto C = v0 - O;
  auto R = cross(D,C);
  float den = dot(Ng,D);
  float rcpDen = rcp(den);
      
  /* perform edge tests */
  float u = dot(R,e2)*rcpDen;
  float v = dot(R,e1)*rcpDen;
          
  /* perform backface culling */        
  bool valid = (den != 0.0f) & (u >= 0.0f) & (v >= 0.0f) & (u+v<=1.0f);
  if (likely(!valid)) return;
      
  /* perform depth test */
  float t = dot(Vec3fa(Ng),C)*rcpDen;
  valid &= (t > ray->tnear()) & (t < ray->tfar);
  if (likely(!valid)) return;
  
  /* update hit */
  ray->tfar = t;
  ray->u = u;
  ray->v = v;
  ray->geomID = geomID;
  ray->primID = primID;
  ray->Ng = Ng;
}